

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpnetworkconnection_p.cpp
# Opt level: O3

void QHttpNetworkConnection::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      onlineStateChanged((QHttpNetworkConnection *)_o,*_a[1]);
      return;
    case 1:
      QHttpNetworkConnectionPrivate::_q_startNextRequest
                (*(QHttpNetworkConnectionPrivate **)(_o + 8));
      return;
    case 2:
      QHttpNetworkConnectionPrivate::_q_hostLookupFinished
                (*(QHttpNetworkConnectionPrivate **)(_o + 8),(QHostInfo *)_a[1]);
      return;
    case 3:
      lVar1 = 0x108;
      if (*(char *)(*(long *)(_o + 8) + 0x9c) != '\0') {
        lVar1 = 0;
      }
      QHttpNetworkConnectionChannel::ensureConnection
                ((QHttpNetworkConnectionChannel *)(lVar1 + *(long *)(*(long *)(_o + 8) + 0xb8)));
      return;
    }
  }
  return;
}

Assistant:

void QHttpNetworkConnection::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QHttpNetworkConnection *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->onlineStateChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->d_func()->_q_startNextRequest(); break;
        case 2: _t->d_func()->_q_hostLookupFinished((*reinterpret_cast< std::add_pointer_t<QHostInfo>>(_a[1]))); break;
        case 3: _t->d_func()->_q_connectDelayedChannel(); break;
        default: ;
        }
    }
}